

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t>::
     BitpackingWriter::WriteConstantDelta
               (hugeint_t constant,uhugeint_t frame_of_reference,idx_t count,uhugeint_t *values,
               bool *validity,void *data_ptr)

{
  uint64_t *puVar1;
  
  ReserveSpace((BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t> *)data_ptr,
               0x20);
  WriteMetaData((BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t> *)data_ptr,
                CONSTANT_DELTA);
  puVar1 = *(uint64_t **)((long)data_ptr + 0x40);
  *puVar1 = frame_of_reference.lower;
  puVar1[1] = frame_of_reference.upper;
  puVar1[2] = constant.lower;
  puVar1[3] = constant.upper;
  *(uint64_t **)((long)data_ptr + 0x40) = puVar1 + 4;
  UpdateStats((BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t> *)data_ptr,
              count);
  return;
}

Assistant:

static void WriteConstantDelta(T_S constant, T frame_of_reference, idx_t count, T *values, bool *validity,
		                               void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, 2 * sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT_DELTA);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}